

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetCommandQueueTypeString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,COMMAND_QUEUE_TYPE Type)

{
  string msg;
  string local_38;
  
  if ((int)this == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",(allocator *)&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((((~(byte)this & 7) != 0) && ((~(byte)this & 3) != 0)) && (((ulong)this & 1) == 0)) {
      FormatString<char[24]>(&local_38,(char (*) [24])"Unexpected context type");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"GetCommandQueueTypeString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x9ca);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    if (((ulong)this & 8) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetCommandQueueTypeString(COMMAND_QUEUE_TYPE Type)
{
    static_assert(COMMAND_QUEUE_TYPE_MAX_BIT == 0x7, "Please update the code below to handle the new command queue type");

    if (Type == COMMAND_QUEUE_TYPE_UNKNOWN)
        return "UNKNOWN";

    String Result;
    if ((Type & COMMAND_QUEUE_TYPE_GRAPHICS) == COMMAND_QUEUE_TYPE_GRAPHICS)
        Result = "GRAPHICS";
    else if ((Type & COMMAND_QUEUE_TYPE_COMPUTE) == COMMAND_QUEUE_TYPE_COMPUTE)
        Result = "COMPUTE";
    else if ((Type & COMMAND_QUEUE_TYPE_TRANSFER) == COMMAND_QUEUE_TYPE_TRANSFER)
        Result = "TRANSFER";
    else
    {
        UNEXPECTED("Unexpected context type");
        Result = "UNKNOWN";
    }

    if ((Type & COMMAND_QUEUE_TYPE_SPARSE_BINDING) != 0)
        Result += " | SPARSE_BINDING";

    return Result;
}